

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

p_ply ply_create(char *name,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                void *pdata)

{
  uint uVar1;
  p_ply __ptr;
  FILE *pFVar2;
  undefined1 *puVar3;
  code *pcVar4;
  
  __ptr = ply_alloc();
  pcVar4 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar4 = error_cb;
  }
  if (__ptr == (p_ply)0x0) {
    __ptr = (p_ply)0x0;
    (*pcVar4)((p_ply)0x0,"Out of memory");
  }
  else {
    pFVar2 = fopen(name,"wb");
    if (pFVar2 == (FILE *)0x0) {
      (*pcVar4)(__ptr,"Unable to create file");
      free(__ptr);
      __ptr = (p_ply)0x0;
    }
    else {
      __ptr->idata = idata;
      __ptr->pdata = pdata;
      uVar1 = storage_mode - PLY_LITTLE_ENDIAN;
      __ptr->io_mode = PLY_WRITE;
      if (uVar1 < 3) {
        puVar3 = (&PTR_ply_odriver_binary_02f9b900)[uVar1];
        storage_mode = *(e_ply_storage_mode *)(&DAT_004463d0 + (ulong)uVar1 * 4);
      }
      else {
        puVar3 = (anonymous_namespace)::ply_odriver_binary_reverse;
      }
      __ptr->odriver = (p_ply_odriver)puVar3;
      __ptr->storage_mode = storage_mode;
      __ptr->fp = (FILE *)pFVar2;
      __ptr->gzfp = (gzFile)0x0;
      __ptr->error_cb = pcVar4;
    }
  }
  return __ptr;
}

Assistant:

p_ply ply_create(const char *name, e_ply_storage_mode storage_mode,
                 p_ply_error_cb error_cb, long idata, void *pdata) {
    FILE *fp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name && storage_mode <= PLY_DEFAULT);
    fp = fopen(name, "wb");
    if (!fp) {
        error_cb(ply, "Unable to create file");
        free(ply);
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII)
        ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else
        ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->gzfp = nullptr;  // gzipped writing isn't implemented...
    ply->error_cb = error_cb;
    return ply;
}